

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

void __thiscall
helics::InputInfo::disconnectFederate(InputInfo *this,GlobalFederateId fedToDisconnect,Time minTime)

{
  pointer pGVar1;
  pointer pTVar2;
  long lVar3;
  long lVar4;
  
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  pGVar1 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->input_sources).
                super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pGVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pTVar2 = (this->deactivated).
             super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if ((pGVar1[lVar4].fed_id.gid == fedToDisconnect.gid) &&
         (minTime.internalTimeCode < pTVar2[lVar4].internalTimeCode)) {
        pTVar2[lVar4].internalTimeCode = minTime.internalTimeCode;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return;
}

Assistant:

void InputInfo::disconnectFederate(GlobalFederateId fedToDisconnect, Time minTime)
{
    // the inputUnits and type are not determined anymore since the source list has changed
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < input_sources.size(); ++ii) {
        if (input_sources[ii].fed_id == fedToDisconnect) {
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}